

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O1

void llb_build_key_destroy(llb_build_key_t *key)

{
  if (key != (llb_build_key_t *)0x0) {
    if (*(llb_build_key_t **)(key + 0x10) != key + 0x20) {
      operator_delete(*(llb_build_key_t **)(key + 0x10),*(long *)(key + 0x20) + 1);
    }
    operator_delete(key,0x38);
    return;
  }
  return;
}

Assistant:

void llb_build_key_destroy(llb_build_key_t *key) {
  delete (CAPIBuildKey *)key;
}